

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O3

lexeme_t<cfgfile::qstring_trait_t> * __thiscall
cfgfile::lexical_analyzer_t<cfgfile::qstring_trait_t>::next_lexeme
          (lexeme_t<cfgfile::qstring_trait_t> *__return_storage_ptr__,
          lexical_analyzer_t<cfgfile::qstring_trait_t> *this)

{
  input_stream_t<cfgfile::qstring_trait_t> *piVar1;
  pos_t pVar2;
  bool bVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  char cVar7;
  bool bVar8;
  char_t cVar9;
  logic_error *plVar10;
  char_t new_char;
  string_t result;
  char_t local_232;
  string local_230;
  lexeme_t<cfgfile::qstring_trait_t> *local_210;
  QArrayData *local_208;
  char16_t *pcStack_200;
  qsizetype local_1f8;
  string local_1f0;
  string_t local_1d0;
  string_t local_1b8;
  QString local_1a0;
  string_t local_188;
  string_t local_170;
  qstring_wrapper_t local_158;
  qstring_wrapper_t local_140;
  qstring_wrapper_t local_128;
  qstring_wrapper_t local_110;
  string local_f8;
  string local_d8;
  qstring_wrapper_t local_b8;
  qstring_wrapper_t local_98;
  qstring_wrapper_t local_78;
  string_t local_60;
  string_t local_48;
  
  local_208 = (QArrayData *)0x0;
  pcStack_200 = (char16_t *)0x0;
  local_1f8 = 0;
  local_210 = __return_storage_ptr__;
  skip_spaces(this);
  piVar1 = this->m_stream;
  pVar2 = piVar1->m_column_number;
  this->m_line_number = piVar1->m_line_number;
  this->m_column_number = pVar2;
  if ((((piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur !=
        (piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) || (cVar7 = QTextStream::atEnd(), cVar7 == '\0')) ||
     (piVar1->m_buf_pos != (piVar1->m_buf).d.size)) {
    bVar3 = true;
    bVar4 = false;
LAB_0012d987:
    cVar9 = input_stream_t<cfgfile::qstring_trait_t>::get(this->m_stream);
    if (cVar9.ucs == const_t<cfgfile::qstring_trait_t>::c_quotes) {
      if (bVar4) goto LAB_0012db67;
      if (!bVar3) {
LAB_0012db5d:
        input_stream_t<cfgfile::qstring_trait_t>::put_back(this->m_stream,cVar9);
        goto LAB_0012db67;
      }
      bVar4 = true;
LAB_0012da3b:
      bVar8 = false;
    }
    else {
      if (cVar9.ucs == const_t<cfgfile::qstring_trait_t>::c_back_slash) {
        local_232.ucs = L'\0';
        if ((bVar4) && (bVar8 = process_back_slash(this,&local_232), !bVar8)) {
          plVar10 = (logic_error *)__cxa_allocate_exception(0x28);
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_230,"Unrecognized back-slash sequence: \"\\","");
          qstring_trait_t::from_ascii(&local_188,&local_230);
          QString::QString(&local_1a0,1,(QChar)local_232.ucs);
          operator+(&local_170,&local_188,(qstring_wrapper_t *)&local_1a0);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"\". In file \"","");
          qstring_trait_t::from_ascii(&local_1b8,&local_d8);
          operator+(&local_158,&local_170,&local_1b8);
          operator+(&local_140,&local_158,&this->m_stream->m_file_name);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"\" on line ","");
          qstring_trait_t::from_ascii(&local_1d0,&local_f8);
          operator+(&local_128,&local_140,&local_1d0);
          qstring_trait_t::to_string(&local_48,this->m_line_number);
          operator+(&local_110,&local_128,&local_48);
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,".","");
          qstring_trait_t::from_ascii(&local_60,&local_1f0);
          operator+(&local_78,&local_110,&local_60);
          std::logic_error::logic_error(plVar10,"Please use desc() method of the exception.");
          *(undefined ***)plVar10 = &PTR__exception_t_00146700;
          *(undefined8 *)(plVar10 + 0x20) = 0;
          uVar5 = local_78.m_str.d.d._0_4_;
          uVar6 = local_78.m_str.d.d._4_4_;
          local_78.m_str.d.d = (Data *)0x0;
          *(undefined4 *)(plVar10 + 0x10) = uVar5;
          *(undefined4 *)(plVar10 + 0x14) = uVar6;
          *(undefined4 *)(plVar10 + 0x18) = local_78.m_str.d.ptr._0_4_;
          *(undefined4 *)(plVar10 + 0x1c) = local_78.m_str.d.ptr._4_4_;
          local_78.m_str.d.ptr = (char16_t *)0x0;
          *(qsizetype *)(plVar10 + 0x20) = local_78.m_str.d.size;
          local_78.m_str.d.size = 0;
          __cxa_throw(plVar10,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                      exception_t<cfgfile::qstring_trait_t>::~exception_t);
        }
        QString::append((QChar)(char16_t)&local_208);
        goto LAB_0012da3b;
      }
      if (cVar9.ucs == const_t<cfgfile::qstring_trait_t>::c_begin_tag) {
        if (local_1f8 != 0) {
LAB_0012da25:
          if (!bVar4) goto LAB_0012db5d;
          goto LAB_0012da2f;
        }
        QString::QString((QString *)&local_230,1,(QChar)cVar9.ucs);
        local_210->m_type = start;
LAB_0012dc09:
        (local_210->m_value).m_str.d.d = (Data *)local_230._M_dataplus._M_p;
        (local_210->m_value).m_str.d.ptr = (char16_t *)local_230._M_string_length;
        (local_210->m_value).m_str.d.size = local_230.field_2._M_allocated_capacity;
        if ((QArrayData *)local_230._M_dataplus._M_p != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_230._M_dataplus._M_p = *(int *)local_230._M_dataplus._M_p + 1;
          UNLOCK();
          if ((QArrayData *)local_230._M_dataplus._M_p != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_230._M_dataplus._M_p = *(int *)local_230._M_dataplus._M_p + -1;
            UNLOCK();
            if (*(int *)local_230._M_dataplus._M_p == 0) {
              QArrayData::deallocate((QArrayData *)local_230._M_dataplus._M_p,2,8);
            }
          }
        }
        goto LAB_0012dc4f;
      }
      if (cVar9.ucs == const_t<cfgfile::qstring_trait_t>::c_end_tag) {
        if (local_1f8 != 0) goto LAB_0012da25;
        QString::QString((QString *)&local_230,1,(QChar)cVar9.ucs);
        local_210->m_type = finish;
        goto LAB_0012dc09;
      }
      if ((cVar9.ucs == const_t<cfgfile::qstring_trait_t>::c_space) ||
         (cVar9.ucs == const_t<cfgfile::qstring_trait_t>::c_tab)) {
        if (bVar4) {
LAB_0012da2f:
          QString::append((QChar)(char16_t)&local_208);
          goto LAB_0012da3b;
        }
        goto LAB_0012db67;
      }
      if ((cVar9.ucs == const_t<cfgfile::qstring_trait_t>::c_carriage_return) ||
         (cVar9.ucs == const_t<cfgfile::qstring_trait_t>::c_line_feed)) {
        if (bVar4) {
          plVar10 = (logic_error *)__cxa_allocate_exception(0x28);
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_230,"Unfinished quoted lexeme. ","");
          qstring_trait_t::from_ascii(&local_170,&local_230);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,"New line detected. In file \"","");
          qstring_trait_t::from_ascii(&local_188,&local_d8);
          operator+(&local_158,&local_170,&local_188);
          operator+(&local_140,&local_158,&this->m_stream->m_file_name);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"\" on line ","");
          qstring_trait_t::from_ascii((string_t *)&local_1a0,&local_f8);
          operator+(&local_128,&local_140,(qstring_wrapper_t *)&local_1a0);
          qstring_trait_t::to_string(&local_1b8,this->m_line_number);
          operator+(&local_110,&local_128,&local_1b8);
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,".","");
          qstring_trait_t::from_ascii(&local_1d0,&local_1f0);
          operator+(&local_98,&local_110,&local_1d0);
          std::logic_error::logic_error(plVar10,"Please use desc() method of the exception.");
          *(undefined ***)plVar10 = &PTR__exception_t_00146700;
          *(undefined8 *)(plVar10 + 0x20) = 0;
          uVar5 = local_98.m_str.d.d._0_4_;
          uVar6 = local_98.m_str.d.d._4_4_;
          local_98.m_str.d.d = (Data *)0x0;
          *(undefined4 *)(plVar10 + 0x10) = uVar5;
          *(undefined4 *)(plVar10 + 0x14) = uVar6;
          *(undefined4 *)(plVar10 + 0x18) = local_98.m_str.d.ptr._0_4_;
          *(undefined4 *)(plVar10 + 0x1c) = local_98.m_str.d.ptr._4_4_;
          local_98.m_str.d.ptr = (char16_t *)0x0;
          *(qsizetype *)(plVar10 + 0x20) = local_98.m_str.d.size;
          local_98.m_str.d.size = 0;
          __cxa_throw(plVar10,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                      exception_t<cfgfile::qstring_trait_t>::~exception_t);
        }
        goto LAB_0012db67;
      }
      if (((cVar9.ucs != const_t<cfgfile::qstring_trait_t>::c_vertical_bar) || (bVar4)) ||
         (bVar8 = input_stream_t<cfgfile::qstring_trait_t>::at_end(this->m_stream), bVar8))
      goto LAB_0012da2f;
      cVar9 = input_stream_t<cfgfile::qstring_trait_t>::get(this->m_stream);
      if (cVar9.ucs == const_t<cfgfile::qstring_trait_t>::c_vertical_bar) {
        skip_one_line_comment(this);
      }
      else {
        if (cVar9.ucs != const_t<cfgfile::qstring_trait_t>::c_sharp) {
          QString::append((QChar)(char16_t)&local_208);
          input_stream_t<cfgfile::qstring_trait_t>::put_back(this->m_stream,cVar9);
          goto LAB_0012da3b;
        }
        skip_multi_line_comment(this);
      }
      if (!bVar3) goto LAB_0012db67;
      bVar8 = true;
      skip_spaces(this);
    }
    piVar1 = this->m_stream;
    if ((((piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur !=
          (piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur) || (cVar7 = QTextStream::atEnd(), cVar7 == '\0'))
       || (piVar1->m_buf_pos != (piVar1->m_buf).d.size)) {
      if (!bVar8) {
        bVar3 = false;
      }
      goto LAB_0012d987;
    }
    if (bVar4) {
      plVar10 = (logic_error *)__cxa_allocate_exception(0x28);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"Unfinished quoted lexeme. ","");
      qstring_trait_t::from_ascii(&local_170,&local_230);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"End of file riched. In file \"","");
      qstring_trait_t::from_ascii(&local_188,&local_d8);
      operator+(&local_158,&local_170,&local_188);
      operator+(&local_140,&local_158,&this->m_stream->m_file_name);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"\" on line ","");
      qstring_trait_t::from_ascii((string_t *)&local_1a0,&local_f8);
      operator+(&local_128,&local_140,(qstring_wrapper_t *)&local_1a0);
      qstring_trait_t::to_string(&local_1b8,this->m_line_number);
      operator+(&local_110,&local_128,&local_1b8);
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,".","");
      qstring_trait_t::from_ascii(&local_1d0,&local_1f0);
      operator+(&local_b8,&local_110,&local_1d0);
      std::logic_error::logic_error(plVar10,"Please use desc() method of the exception.");
      *(undefined ***)plVar10 = &PTR__exception_t_00146700;
      *(undefined8 *)(plVar10 + 0x20) = 0;
      uVar5 = local_b8.m_str.d.d._0_4_;
      uVar6 = local_b8.m_str.d.d._4_4_;
      local_b8.m_str.d.d = (Data *)0x0;
      *(undefined4 *)(plVar10 + 0x10) = uVar5;
      *(undefined4 *)(plVar10 + 0x14) = uVar6;
      *(undefined4 *)(plVar10 + 0x18) = local_b8.m_str.d.ptr._0_4_;
      *(undefined4 *)(plVar10 + 0x1c) = local_b8.m_str.d.ptr._4_4_;
      local_b8.m_str.d.ptr = (char16_t *)0x0;
      *(qsizetype *)(plVar10 + 0x20) = local_b8.m_str.d.size;
      local_b8.m_str.d.size = 0;
      __cxa_throw(plVar10,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                  exception_t<cfgfile::qstring_trait_t>::~exception_t);
    }
    if (local_1f8 != 0) {
LAB_0012db67:
      local_210->m_type = string;
      (local_210->m_value).m_str.d.d = (Data *)local_208;
      (local_210->m_value).m_str.d.ptr = pcStack_200;
      (local_210->m_value).m_str.d.size = local_1f8;
      if (local_208 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&local_208->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&local_208->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_0012dc4f;
    }
  }
  local_210->m_type = null;
  (local_210->m_value).m_str.d.d = (Data *)0x0;
  (local_210->m_value).m_str.d.ptr = (char16_t *)0x0;
  (local_210->m_value).m_str.d.size = 0;
LAB_0012dc4f:
  if (local_208 != (QArrayData *)0x0) {
    LOCK();
    (local_208->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_208->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_208->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_208,2,8);
    }
  }
  return local_210;
}

Assistant:

lexeme_t< Trait > next_lexeme()
	{
		typename Trait::string_t result;

		bool quoted_lexeme = false;
		bool first_symbol = true;
		bool skip_comment = false;

		skip_spaces();

		m_line_number = m_stream.line_number();
		m_column_number = m_stream.column_number();

		if( m_stream.at_end() )
			return lexeme_t< Trait >( lexeme_type_t::null,
				typename Trait::string_t() );

		while( true )
		{
			typename Trait::char_t ch = m_stream.get();

			if( ch == const_t< Trait >::c_quotes )
			{
				if( quoted_lexeme )
					break;
				else if( first_symbol )
					quoted_lexeme = true;
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_back_slash )
			{
				typename Trait::char_t new_char( 0x00 );

				if( !quoted_lexeme )
					result.push_back( ch );
				else if( process_back_slash( new_char ) )
					result.push_back( new_char );
				else
					throw exception_t< Trait >(
						Trait::from_ascii( "Unrecognized back-slash "
							"sequence: \"\\" ) +
						typename Trait::string_t( 1, new_char ) +
						Trait::from_ascii( "\". In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
			}
			else if( ch == const_t< Trait >::c_begin_tag )
			{
				if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::start,
						typename Trait::string_t( 1, ch ) );
				else if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_end_tag )
			{
				if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::finish,
						typename Trait::string_t( 1, ch ) );
				else if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_space ||
				ch == const_t< Trait >::c_tab )
			{
				if( quoted_lexeme )
					result.push_back( ch );
				else
					break;
			}
			else if( ch == const_t< Trait >::c_carriage_return ||
				ch == const_t< Trait >::c_line_feed )
			{
				if( quoted_lexeme )
					throw exception_t< Trait >(
						Trait::from_ascii( "Unfinished quoted lexeme. " ) +
						Trait::from_ascii( "New line detected. In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
				else
					break;
			}
			else if( ch == const_t< Trait >::c_vertical_bar )
			{
				if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					if( !m_stream.at_end() )
					{
						typename Trait::char_t next_char = m_stream.get();

						if( next_char == const_t< Trait >::c_vertical_bar )
						{
							skip_comment = true;

							skip_one_line_comment();

							if( first_symbol )
								skip_spaces();
							else
								break;
						}
						else if( next_char == const_t< Trait >::c_sharp )
						{
							skip_comment = true;

							skip_multi_line_comment();

							if( first_symbol )
								skip_spaces();
							else
								break;
						}
						else
						{
							result.push_back( ch );

							m_stream.put_back( next_char );
						}
					}
					else
						result.push_back( ch );
				}
			}
			else
				result.push_back( ch );

			if( m_stream.at_end() )
			{
				if( quoted_lexeme )
					throw exception_t< Trait >(
						Trait::from_ascii( "Unfinished quoted lexeme. " ) +
						Trait::from_ascii( "End of file riched. In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
				else if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::null,
						typename Trait::string_t() );
				else
					break;
			}

			if( !skip_comment )
				first_symbol = false;
			else
				skip_comment = false;
		}

		return lexeme_t< Trait >( lexeme_type_t::string, result );
	}